

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

int __thiscall cppcms::json::anon_unknown_9::tockenizer::next(tockenizer *this)

{
  bool bVar1;
  int iVar2;
  tockenizer *this_00;
  char *in_RDI;
  int c;
  streambuf *buf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  std::ios::rdbuf();
  do {
    iVar2 = std::streambuf::sbumpc();
    if (iVar2 == -1) {
      return 0xff;
    }
    this_00 = (tockenizer *)(ulong)(iVar2 - 9);
    switch(this_00) {
    case (tockenizer *)0x0:
    case (tockenizer *)0x4:
    case (tockenizer *)0x17:
      break;
    case (tockenizer *)0x1:
      *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
      break;
    default:
      return 0x100;
    case (tockenizer *)0x19:
      std::streambuf::sungetc();
      bVar1 = parse_string((tockenizer *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (!bVar1) {
        return 0x100;
      }
      return 0x101;
    case (tockenizer *)0x23:
    case (tockenizer *)0x31:
    case (tockenizer *)0x52:
    case (tockenizer *)0x54:
    case (tockenizer *)0x72:
    case (tockenizer *)0x74:
      return iVar2;
    case (tockenizer *)0x24:
    case (tockenizer *)0x27:
    case (tockenizer *)0x28:
    case (tockenizer *)0x29:
    case (tockenizer *)0x2a:
    case (tockenizer *)0x2b:
    case (tockenizer *)0x2c:
    case (tockenizer *)0x2d:
    case (tockenizer *)0x2e:
    case (tockenizer *)0x2f:
    case (tockenizer *)0x30:
      std::streambuf::sungetc();
      bVar1 = parse_number(this_00);
      if (!bVar1) {
        return 0x100;
      }
      return 0x102;
    case (tockenizer *)0x26:
      bVar1 = check((tockenizer *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
      if (!bVar1) {
        return 0x100;
      }
      do {
        iVar2 = std::streambuf::sbumpc();
      } while (iVar2 != -1 && iVar2 != 10);
      if (iVar2 != 10) {
        return 0xff;
      }
      break;
    case (tockenizer *)0x5d:
      bVar1 = check((tockenizer *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
      if (!bVar1) {
        return 0x100;
      }
      return 0x104;
    case (tockenizer *)0x65:
      bVar1 = check((tockenizer *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
      if (!bVar1) {
        return 0x100;
      }
      return 0x105;
    case (tockenizer *)0x6b:
      bVar1 = check((tockenizer *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
      if (!bVar1) {
        return 0x100;
      }
      return 0x103;
    }
  } while( true );
}

Assistant:

int next()
			{
				std::streambuf *buf = is_.rdbuf();
				for(;;) {
					int c;
					if((c=buf->sbumpc())==-1)
						return tock_eof;
					switch(c) {
					case '[':
					case '{':
					case ':':
					case ',':
					case '}':
					case ']':
						return c;
					case ' ':
					case '\t':
					case '\r':
						break;
					case '\n':
						line++;
						break;
					case '"':
						buf->sungetc();
						if(parse_string())
							return tock_str;
						return tock_err;
					case 't':
						if(check("rue"))
							return tock_true;
						return tock_err;
					case 'n':
						if(check("ull"))
							return tock_null;
						return tock_err;
					case 'f':
						if(check("alse"))
							return tock_false;
						return tock_err;
					case '-':
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
					case '8':
					case '9':
						buf->sungetc();
						if(parse_number())
							return tock_number;
						return tock_err;
					case '/':
						if(check("/")) {
							while((c=buf->sbumpc())!=-1 && c!='\n')
								;
							if(c=='\n')
								break;
							return tock_eof;
						}
						return tock_err;
					default:
						return tock_err;
					}
				}
			}